

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O3

int main(int32 argc,char **argv)

{
  logmath_t *name;
  uint uVar1;
  int iVar2;
  cmd_ln_t *config;
  char *pcVar3;
  FILE *pFVar4;
  ps_decoder_t *ps;
  char *pcVar5;
  FILE *pFVar6;
  FILE *__stream;
  FILE *pFVar7;
  char *string;
  char *string_00;
  char *pcVar8;
  char *pcVar9;
  ps_mllr_t *mllr;
  ps_mllr_t *ppVar10;
  fsg_model_t *fsg;
  ps_seg_t *itor;
  long lVar11;
  double dVar12;
  size_t len;
  double n_wall;
  double n_cpu;
  double n_speech;
  char *wptr [4];
  char *local_148;
  char *local_138;
  uint local_130;
  uint local_12c;
  char *local_128;
  FILE *local_120;
  size_t local_118;
  int local_110;
  int local_10c;
  FILE *local_108;
  FILE *local_100;
  logmath_t *local_f8;
  char *local_f0;
  FILE *local_e8;
  FILE *local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_bc;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  long local_a0;
  long local_98;
  FILE *local_90;
  long local_88;
  char *local_80;
  FILE *local_78;
  long local_70;
  char *local_68;
  FILE *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  config = cmd_ln_parse_r((ps_config_t *)0x0,ps_args_def,argc,argv,1);
  if ((config == (cmd_ln_t *)0x0) ||
     ((pcVar3 = ps_config_str(config,"argfile"), pcVar3 != (char *)0x0 &&
      (config = cmd_ln_parse_file_r(config,ps_args_def,pcVar3,0), config == (cmd_ln_t *)0x0)))) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,ps_args_def);
    return 1;
  }
  pcVar3 = ps_config_str(config,"ctl");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = "-ctl argument not present, nothing to do in batch mode!\n";
    lVar11 = 0x3a8;
LAB_00108464:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,lVar11,pcVar3);
LAB_00108470:
    exit(1);
  }
  pFVar4 = fopen(pcVar3,"r");
  if (pFVar4 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x3ab,"Failed to open control file \'%s\'",pcVar3);
    goto LAB_00108470;
  }
  ps_default_search_args(config);
  ps = ps_init(config);
  if (ps == (ps_decoder_t *)0x0) {
    ps_config_free(config);
    fclose(pFVar4);
    pcVar3 = "PocketSphinx decoder init failed\n";
    lVar11 = 0x3b2;
    goto LAB_00108464;
  }
  local_88 = ps_config_int(config,"ctloffset");
  local_a0 = ps_config_int(config,"ctlcount");
  local_98 = ps_config_int(config,"ctlincr");
  pcVar3 = ps_config_str(config,"outlatdir");
  local_68 = ps_config_str(config,"nbestdir");
  local_70 = ps_config_int(config,"frate");
  pcVar5 = ps_config_str(config,"mllrctl");
  if (pcVar5 != (char *)0x0) {
    pFVar6 = fopen(pcVar5,"r");
    if (pFVar6 != (FILE *)0x0) goto LAB_001077e8;
    pcVar3 = "Failed to open MLLR control file file %s";
    lVar11 = 0x2c2;
LAB_00107885:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar11,pcVar3,pcVar5);
    goto LAB_001083da;
  }
  pFVar6 = (FILE *)0x0;
LAB_001077e8:
  pcVar5 = ps_config_str(config,"fsgctl");
  if (pcVar5 == (char *)0x0) {
    local_90 = (FILE *)0x0;
  }
  else {
    local_90 = fopen(pcVar5,"r");
    if (local_90 == (FILE *)0x0) {
      pcVar3 = "Failed to open FSG control file file %s";
      lVar11 = 0x2c9;
      goto LAB_00107885;
    }
  }
  local_80 = pcVar3;
  pcVar5 = ps_config_str(config,"alignctl");
  if (pcVar5 == (char *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fopen(pcVar5,"r");
    if (__stream == (FILE *)0x0) {
      pcVar3 = "Failed to open alignment control file file %s";
      lVar11 = 0x2d0;
      goto LAB_00107885;
    }
  }
  pcVar3 = ps_config_str(config,"lmnamectl");
  if (pcVar3 == (char *)0x0) {
    pFVar7 = (FILE *)0x0;
LAB_001078e1:
    local_60 = pFVar7;
    pcVar3 = ps_config_str(config,"hyp");
    if (pcVar3 == (char *)0x0) {
      local_120 = (FILE *)0x0;
    }
    else {
      pFVar7 = fopen(pcVar3,"w");
      if (pFVar7 == (FILE *)0x0) {
        pcVar5 = "Failed to open hypothesis file %s for writing";
        lVar11 = 0x2de;
        goto LAB_001079ce;
      }
      local_120 = pFVar7;
      setbuf(pFVar7,(char *)0x0);
    }
    pcVar3 = ps_config_str(config,"hypseg");
    if (pcVar3 == (char *)0x0) {
      local_100 = (FILE *)0x0;
LAB_0010797b:
      pcVar3 = ps_config_str(config,"ctm");
      if (pcVar3 == (char *)0x0) {
        local_108 = (FILE *)0x0;
      }
      else {
        pFVar7 = fopen(pcVar3,"w");
        if (pFVar7 == (FILE *)0x0) {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x2ee,"Failed to open hypothesis file %s for writing",pcVar3);
          pFVar6 = (FILE *)0x0;
          goto LAB_001083a2;
        }
        local_108 = pFVar7;
        setbuf(pFVar7,(char *)0x0);
      }
      local_f0 = fread_line((FILE *)pFVar4,&local_118);
      local_e8 = pFVar4;
      local_e0 = __stream;
      if (local_f0 != (char *)0x0) {
        local_bc = (int)local_88 + (int)local_a0;
        local_130 = 0;
        local_78 = pFVar6;
        do {
          __stream = local_e0;
          if (local_78 != (FILE *)0x0) {
            pcVar3 = fread_line((FILE *)local_78,&local_118);
            if (pcVar3 != (char *)0x0) {
              local_148 = string_trim(pcVar3,STRING_BOTH);
              goto LAB_00107a7b;
            }
            pcVar3 = "File size mismatch between control and MLLR control\n";
            lVar11 = 0x2ff;
LAB_00108355:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                    ,lVar11,pcVar3);
LAB_00108387:
            ckd_free(local_f0);
            ckd_free((void *)0x0);
            pFVar6 = local_108;
            goto LAB_001083a2;
          }
          pcVar3 = (char *)0x0;
          local_148 = (char *)0x0;
LAB_00107a7b:
          if (local_60 == (FILE *)0x0) {
            pcVar5 = (char *)0x0;
            local_f8 = (logmath_t *)0x0;
          }
          else {
            pcVar5 = fread_line((FILE *)local_60,&local_118);
            if (pcVar5 == (char *)0x0) {
              pcVar3 = "File size mismatch between control and LM control\n";
              lVar11 = 0x309;
              goto LAB_00108355;
            }
            local_f8 = (logmath_t *)string_trim(pcVar5,STRING_BOTH);
          }
          if (local_90 == (FILE *)0x0) {
            string = (char *)0x0;
            local_138 = (char *)0x0;
          }
          else {
            string = fread_line((FILE *)local_90,&local_118);
            if (string == (char *)0x0) {
              pcVar3 = "File size mismatch between control and FSG control\n";
              lVar11 = 0x313;
              goto LAB_00108355;
            }
            local_138 = string_trim(string,STRING_BOTH);
          }
          if (__stream == (FILE *)0x0) {
            string_00 = (char *)0x0;
            pcVar8 = (char *)0x0;
          }
          else {
            string_00 = fread_line((FILE *)__stream,&local_118);
            if (string_00 == (char *)0x0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0x31d,"File size mismatch between control and align control\n");
              __stream = local_e0;
              goto LAB_00108387;
            }
            pcVar8 = string_trim(string_00,STRING_BOTH);
          }
          if ((int)local_130 < (int)local_88) {
            local_130 = local_130 + (int)local_98;
LAB_00107bf6:
            ckd_free(string_00);
            ckd_free(pcVar3);
            ckd_free(string);
            ckd_free(pcVar5);
            ckd_free(local_f0);
          }
          else {
            if (((int)local_a0 != -1) && (local_bc <= (int)local_130)) goto LAB_00107bf6;
            local_a8 = pcVar8;
            uVar1 = str2words(local_f0,&local_58,4);
            if (uVar1 == 0) {
LAB_00107be2:
              local_130 = local_130 + (int)local_98;
              pFVar4 = local_e8;
              goto LAB_00107bf6;
            }
            if ((int)uVar1 < 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0x334,"Unexpected extra data in control file at line %d\n",(ulong)local_130);
              goto LAB_00107be2;
            }
            local_b0 = local_58;
            local_10c = -1;
            if (uVar1 == 1) {
              local_110 = 0;
            }
            else {
              local_110 = atoi(local_50);
              if (2 < uVar1) {
                local_10c = atoi(local_48);
              }
            }
            local_128 = local_b0;
            if (3 < uVar1) {
              local_128 = local_40;
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                    ,0x344,"Decoding \'%s\'\n");
            pcVar8 = process_mllrctl_line_lastfile;
            if ((local_148 == (char *)0x0) ||
               ((process_mllrctl_line_lastfile != (char *)0x0 &&
                (iVar2 = strcmp(local_148,process_mllrctl_line_lastfile), iVar2 == 0)))) {
LAB_00107df5:
              name = local_f8;
              if (local_f8 == (logmath_t *)0x0) {
LAB_00107e59:
                pcVar8 = ps_config_str(config,"fsgdir");
                pcVar9 = ps_config_str(config,"fsgext");
                if (local_138 != (char *)0x0) {
                  if (pcVar8 == (char *)0x0) {
                    if (pcVar9 == (char *)0x0) {
                      pcVar8 = __ckd_salloc__(local_138,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                              ,0x12f);
                    }
                    else {
                      pcVar8 = string_join(local_138,pcVar9,0);
                    }
                  }
                  else {
                    if (pcVar9 == (char *)0x0) {
                      pcVar9 = "";
                    }
                    pcVar8 = string_join(pcVar8,"/",local_138,pcVar9,0);
                  }
                  local_f8 = ps_get_logmath(ps);
                  dVar12 = ps_config_float(config,"lw");
                  fsg = fsg_model_readfile(pcVar8,local_f8,(float32)(float)dVar12);
                  if ((fsg == (fsg_model_t *)0x0) ||
                     (iVar2 = ps_add_fsg(ps,local_138,fsg), iVar2 != 0)) {
                    fsg_model_free(fsg);
                    goto LAB_00107f5c;
                  }
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x13d,"Using FSG: %s\n");
                  iVar2 = ps_activate_search(ps,local_138);
                  fsg_model_free(fsg);
                  ckd_free(pcVar8);
                  pFVar4 = local_e8;
                  if (iVar2 != 0) goto LAB_00107c20;
                }
                iVar2 = process_alignctl_line(ps,config,local_a8);
                pFVar4 = local_e8;
                if ((-1 < iVar2) &&
                   (iVar2 = process_ctl_line(ps,config,local_b0,local_128,local_110,local_10c),
                   pFVar4 = local_e8, -1 < iVar2)) {
                  if (local_120 == (FILE *)0x0) {
LAB_00108052:
                    local_148 = (char *)0x0;
                  }
                  else {
                    if (local_a8 != (char *)0x0) {
                      pcVar8 = get_align_hyp(ps,(int *)&local_12c);
                      fprintf(local_120,"%s (%s %d)\n",pcVar8,local_128,(ulong)local_12c);
                      ckd_free(pcVar8);
                      goto LAB_00108052;
                    }
                    local_148 = ps_get_hyp(ps,(int32 *)&local_12c);
                    pcVar8 = local_148;
                    if (local_148 == (char *)0x0) {
                      pcVar8 = "";
                    }
                    fprintf(local_120,"%s (%s %d)\n",pcVar8,local_128,(ulong)local_12c);
                  }
                  if (local_100 != (FILE *)0x0) {
                    write_hypseg((FILE *)local_100,ps,local_128);
                  }
                  pFVar4 = local_108;
                  if (local_108 != (FILE *)0x0) {
                    itor = ps_seg_iter(ps);
                    write_ctm((FILE *)pFVar4,ps,itor,local_128,(int32)local_70);
                  }
                  if (local_80 != (char *)0x0) {
                    write_lattice(ps,local_80,local_128);
                  }
                  if (local_68 != (char *)0x0) {
                    write_nbest(ps,local_68,local_128);
                  }
                  ps_get_utt_time(ps,&local_c8,&local_d0,&local_d8);
                  pcVar8 = local_128;
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x370,"%s: %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",
                          local_c8,local_d0,local_d8,local_128);
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x372,"%s: %.2f xRT (CPU), %.2f xRT (elapsed)\n",local_d0 / local_c8,
                          local_d8 / local_c8,pcVar8);
                  if (local_148 == (char *)0x0) {
                    local_148 = "";
                  }
                  err_msg(ERR_INFO,(char *)0x0,0,"%s (%s %d)\n",local_148,pcVar8,local_12c);
                  err_msg(ERR_INFO,(char *)0x0,0,"%s done --------------------------------------\n",
                          pcVar8);
                  goto LAB_00107be2;
                }
              }
              else {
                err_msg(ERR_INFO,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x14f,"Using language model: %s\n",local_f8);
                iVar2 = ps_activate_search(ps,(char *)name);
                if (iVar2 == 0) goto LAB_00107e59;
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x151,"No such language model: %s\n",name);
                pFVar4 = local_e8;
              }
            }
            else {
              ckd_free(pcVar8);
              process_mllrctl_line_lastfile =
                   __ckd_salloc__(local_148,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                  ,0x104);
              pcVar8 = ps_config_str(config,"mllrext");
              pcVar9 = ps_config_str(config,"mllrdir");
              if (pcVar9 == (char *)0x0) {
                if (pcVar8 == (char *)0x0) {
                  local_b8 = __ckd_salloc__(local_148,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                            ,0x10d);
                }
                else {
                  local_b8 = string_join(local_148,pcVar8,0);
                }
              }
              else {
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "";
                }
                local_b8 = string_join(pcVar9,"/",local_148,pcVar8,0);
              }
              mllr = ps_mllr_read(local_b8);
              pcVar8 = local_b8;
              if (mllr != (ps_mllr_t *)0x0) {
                ppVar10 = ps_update_mllr(ps,mllr);
                if (ppVar10 != (ps_mllr_t *)0x0) {
                  err_msg(ERR_INFO,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,0x119,"Using MLLR: %s\n",local_148);
                  ckd_free(local_b8);
                  goto LAB_00107df5;
                }
                ps_mllr_free(mllr);
                pcVar8 = local_b8;
              }
LAB_00107f5c:
              ckd_free(pcVar8);
              pFVar4 = local_e8;
            }
          }
LAB_00107c20:
          local_f0 = fread_line((FILE *)pFVar4,&local_118);
        } while (local_f0 != (char *)0x0);
      }
      ps_get_all_time(ps,&local_c8,&local_d0,&local_d8);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x382,"TOTAL %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",local_c8,
              local_d0,local_d8);
      __stream = local_e0;
      pFVar4 = local_e8;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,900,"AVERAGE %.2f xRT (CPU), %.2f xRT (elapsed)\n",local_d0 / local_c8,
              local_d8 / local_c8);
      pFVar6 = local_108;
    }
    else {
      local_100 = fopen(pcVar3,"w");
      if (local_100 != (FILE *)0x0) {
        setbuf(local_100,(char *)0x0);
        goto LAB_0010797b;
      }
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x2e6,"Failed to open hypothesis file %s for writing",pcVar3);
      local_100 = (FILE *)0x0;
      pFVar6 = (FILE *)0x0;
    }
LAB_001083a2:
    if (local_120 != (FILE *)0x0) {
      fclose(local_120);
    }
    if (local_100 != (FILE *)0x0) {
      fclose(local_100);
    }
    if (pFVar6 != (FILE *)0x0) {
      fclose(pFVar6);
    }
  }
  else {
    pFVar7 = fopen(pcVar3,"r");
    if (pFVar7 != (FILE *)0x0) goto LAB_001078e1;
    pcVar5 = "Failed to open LM name control file file %s";
    lVar11 = 0x2d7;
LAB_001079ce:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,lVar11,pcVar5,pcVar3);
  }
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
LAB_001083da:
  fclose(pFVar4);
  ps_free(ps);
  ps_config_free(config);
  return 0;
}

Assistant:

int
main(int32 argc, char *argv[])
{
    ps_decoder_t *ps;
    cmd_ln_t *config;
    char const *ctl;
    FILE *ctlfh;

    config = cmd_ln_parse_r(NULL, ps_args_def, argc, argv, TRUE);

    /* Handle argument file as -argfile. */
    if (config && (ctl = ps_config_str(config, "argfile")) != NULL) {
        config = cmd_ln_parse_file_r(config, ps_args_def, ctl, FALSE);
    }
    
    if (config == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, ps_args_def);
        return 1;
    }

    if ((ctl = ps_config_str(config, "ctl")) == NULL) {
        E_FATAL("-ctl argument not present, nothing to do in batch mode!\n");
    }
    if ((ctlfh = fopen(ctl, "r")) == NULL) {
        E_FATAL_SYSTEM("Failed to open control file '%s'", ctl);
    }

    ps_default_search_args(config);
    if (!(ps = ps_init(config))) {
        ps_config_free(config);
        fclose(ctlfh);
        E_FATAL("PocketSphinx decoder init failed\n");
    }

    process_ctl(ps, config, ctlfh);

    fclose(ctlfh);
    ps_free(ps);
    ps_config_free(config);
    return 0;
}